

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

void __thiscall
stackjit::ClassMetadataProvider::createVirtualFunctionTables
          (ClassMetadataProvider *this,VMState *vmState)

{
  bool bVar1;
  reference ppVar2;
  ClassMetadata *this_00;
  ostream *poVar3;
  string *psVar4;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  reference ppVar5;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *virtualFunc;
  const_iterator __end3;
  const_iterator __begin3;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  bool createdVTable;
  ClassMetadata *currentClass;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>
  *current;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>_>_>
  *__range1;
  VMState *vmState_local;
  ClassMetadataProvider *this_local;
  
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>_>_>
           ::begin(&this->mClassesMetadata);
  current = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>_>_>
               ::end(&this->mClassesMetadata);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>,_true>
                         *)&current);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>,_false,_true>
             ::operator*(&__end1);
    this_00 = &ppVar2->second;
    bVar1 = ClassMetadata::makeVirtualFunctionTable(this_00);
    if (((bVar1) && (((vmState->config).enableDebug & 1U) != 0)) &&
       (((vmState->config).printVirtualFunctionTableLayout & 1U) != 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"V-table for ");
      psVar4 = ClassMetadata::name_abi_cxx11_(this_00);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_01 = ClassMetadata::virtualFunctions_abi_cxx11_(this_00);
      __end3 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(this_01);
      virtualFunc = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)std::
                       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::end(this_01);
      while( true ) {
        bVar1 = std::operator!=(&__end3,(_Self *)&virtualFunc);
        if (!bVar1) break;
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end3);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,ppVar5->first);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,(string *)&ppVar5->second);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::
        _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end3);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ClassMetadata>,_false,_true>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ClassMetadataProvider::createVirtualFunctionTables(const VMState& vmState) {
		for (auto& current : mClassesMetadata) {
			auto& currentClass = current.second;
			auto createdVTable = currentClass.makeVirtualFunctionTable();

			if (createdVTable && vmState.config.enableDebug && vmState.config.printVirtualFunctionTableLayout) {
				std::cout << "V-table for " << currentClass.name() << std::endl;

				for (auto& virtualFunc : currentClass.virtualFunctions()) {
					std::cout << virtualFunc.first << ": " << virtualFunc.second << std::endl;
				}

				std::cout << std::endl;
			}
		}
	}